

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position
          )

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [64];
  batch sin_angle;
  batch cos_angle;
  batch *pbVar4;
  PolarExtentCoreContext *ctx_00;
  PolarExtentCoreContext *ctx_01;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> position_t;
  undefined1 in_stack_fffffffffffffd80 [62];
  ushort uVar9;
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> local_140;
  
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_>::transform
            (&local_140,(PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *)ctx,
             (extent_float_t *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4));
  auVar5 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
  auVar6 = vandps_avx512dq(auVar5,(undefined1  [64])
                                  local_140.x.super_simd_register<float,_xsimd::avx512bw>.
                                  super_simd_register<float,_xsimd::avx512dq>.
                                  super_simd_register<float,_xsimd::avx512cd>.
                                  super_simd_register<float,_xsimd::avx512f>.data);
  uVar1 = *(undefined4 *)((long)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7._16_4_ = uVar1;
  auVar7._20_4_ = uVar1;
  auVar7._24_4_ = uVar1;
  auVar7._28_4_ = uVar1;
  auVar7._32_4_ = uVar1;
  auVar7._36_4_ = uVar1;
  auVar7._40_4_ = uVar1;
  auVar7._44_4_ = uVar1;
  auVar7._48_4_ = uVar1;
  auVar7._52_4_ = uVar1;
  auVar7._56_4_ = uVar1;
  auVar7._60_4_ = uVar1;
  auVar7 = vmulps_avx512f((undefined1  [64])
                          local_140.y.super_simd_register<float,_xsimd::avx512bw>.
                          super_simd_register<float,_xsimd::avx512dq>.
                          super_simd_register<float,_xsimd::avx512cd>.
                          super_simd_register<float,_xsimd::avx512f>.data,auVar7);
  uVar1 = *(undefined4 *)&this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar8._16_4_ = uVar1;
  auVar8._20_4_ = uVar1;
  auVar8._24_4_ = uVar1;
  auVar8._28_4_ = uVar1;
  auVar8._32_4_ = uVar1;
  auVar8._36_4_ = uVar1;
  auVar8._40_4_ = uVar1;
  auVar8._44_4_ = uVar1;
  auVar8._48_4_ = uVar1;
  auVar8._52_4_ = uVar1;
  auVar8._56_4_ = uVar1;
  auVar8._60_4_ = uVar1;
  auVar7 = vfmadd231ps_avx512f(auVar7,auVar6,auVar8);
  uVar2 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar7,2);
  uVar9 = (ushort)uVar2;
  vandps_avx512dq(auVar5,(undefined1  [64])
                         local_140.z.super_simd_register<float,_xsimd::avx512bw>.
                         super_simd_register<float,_xsimd::avx512dq>.
                         super_simd_register<float,_xsimd::avx512cd>.
                         super_simd_register<float,_xsimd::avx512f>.data);
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf].
  _2_2_ = uVar9;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_62_
       = in_stack_fffffffffffffd80;
  weight_from_sin(__return_storage_ptr__,this,ctx_00,sin_angle);
  uVar1 = *(undefined4 *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar5._16_4_ = uVar1;
  auVar5._20_4_ = uVar1;
  auVar5._24_4_ = uVar1;
  auVar5._28_4_ = uVar1;
  auVar5._32_4_ = uVar1;
  auVar5._36_4_ = uVar1;
  auVar5._40_4_ = uVar1;
  auVar5._44_4_ = uVar1;
  auVar5._48_4_ = uVar1;
  auVar5._52_4_ = uVar1;
  auVar5._56_4_ = uVar1;
  auVar5._60_4_ = uVar1;
  auVar8 = vmulps_avx512f((undefined1  [64])
                          local_140.y.super_simd_register<float,_xsimd::avx512bw>.
                          super_simd_register<float,_xsimd::avx512dq>.
                          super_simd_register<float,_xsimd::avx512cd>.
                          super_simd_register<float,_xsimd::avx512f>.data,auVar5);
  uVar1 = *(undefined4 *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar3._16_4_ = uVar1;
  auVar3._20_4_ = uVar1;
  auVar3._24_4_ = uVar1;
  auVar3._28_4_ = uVar1;
  auVar3._32_4_ = uVar1;
  auVar3._36_4_ = uVar1;
  auVar3._40_4_ = uVar1;
  auVar3._44_4_ = uVar1;
  auVar3._48_4_ = uVar1;
  auVar3._52_4_ = uVar1;
  auVar3._56_4_ = uVar1;
  auVar3._60_4_ = uVar1;
  vfmadd231ps_avx512f(auVar8,auVar6,auVar3);
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf].
  _2_2_ = uVar9;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_62_
       = in_stack_fffffffffffffd80;
  pbVar4 = weight_from_cos(__return_storage_ptr__,this,ctx_01,cos_angle);
  if ((uVar9 != 0) &&
     (pbVar4 = (batch *)CONCAT44((int)((ulong)pbVar4 >> 0x20),(uint)uVar9), uVar9 != 0xffff)) {
    vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar7,2);
  }
  return pbVar4;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }